

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEquationFilter.cpp
# Opt level: O3

void __thiscall
TPZEquationFilter::ScatterInternal<double>
          (TPZEquationFilter *this,TPZFMatrix<double> *vsmall,TPZFMatrix<double> *vexpand)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int64_t iVar6;
  double extraout_XMM0_Qa;
  
  iVar6 = this->fNumEq;
  if (this->fIsActive != false) {
    iVar6 = (this->fActiveEqs).fNElements;
  }
  if ((((vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow == iVar6) &&
      ((vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow == this->fNumEq)) &&
     ((vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <=
      (vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    if ((this->fIsActive & 1U) == 0) {
      TPZFMatrix<double>::operator=(vexpand,vsmall);
      return;
    }
    (*(vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              (vexpand);
    lVar1 = (vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (0 < lVar1) {
      lVar5 = 0;
      do {
        if (0 < iVar6) {
          lVar4 = 0;
          do {
            (*(vsmall->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(vsmall,lVar4,lVar5);
            lVar2 = (this->fActiveEqs).fStore[lVar4];
            if (((lVar2 < 0) ||
                (lVar3 = (vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar3 <= lVar2
                )) || ((vexpand->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar5)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            vexpand->fElem[lVar3 * lVar5 + lVar2] = extraout_XMM0_Qa;
            lVar4 = lVar4 + 1;
          } while (iVar6 != lVar4);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != lVar1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &) const [TVar = double]"
             ,0x6b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Incompatible dimensions\nAborting...\n",0x2c);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZEquationFilter.cpp"
             ,0x4a);
}

Assistant:

void TPZEquationFilter::ScatterInternal(const TPZFMatrix<TVar> &vsmall,
                     TPZFMatrix<TVar> &vexpand) const {
  int64_t neqcondense = this->NActiveEquations();
  if (vsmall.Rows() != neqcondense || vexpand.Rows() != fNumEq ||
      vsmall.Cols() > vexpand.Cols()) {
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: Incompatible dimensions\nAborting...\n";
    DebugStop();
  }
  if (!IsActive()) {
    vexpand = vsmall;
    return;
  }
  vexpand.Zero();

#ifdef PZDEBUG
  {
    for (int64_t i = 0; i < neqcondense; i++) {
      if (fActiveEqs[i] >= fNumEq) {
        DebugStop();
      }
    }
  }
#endif
  const auto ncols = vsmall.Cols();
  for(auto j = 0; j < ncols; j++)
    for (int64_t i = 0; i < neqcondense; i++)
      vexpand(fActiveEqs[i], j) = vsmall.GetVal(i, j);
}